

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O3

int tpack(lua_State *L)

{
  bool bVar1;
  uint narray;
  ulong n;
  
  narray = lua_gettop(L);
  lua_createtable(L,narray,1);
  lua_rotate(L,1,1);
  if (0 < (int)narray) {
    n = (ulong)narray;
    do {
      lua_seti(L,1,n);
      bVar1 = 1 < n;
      n = n - 1;
    } while (bVar1);
  }
  lua_pushinteger(L,(long)(int)narray);
  lua_setfield(L,1,"n");
  return 1;
}

Assistant:

static int tpack (lua_State *L) {
  int i;
  int n = lua_gettop(L);  /* number of elements to pack */
  lua_createtable(L, n, 1);  /* create result table */
  lua_insert(L, 1);  /* put it at index 1 */
  for (i = n; i >= 1; i--)  /* assign elements */
    lua_seti(L, 1, i);
  lua_pushinteger(L, n);
  lua_setfield(L, 1, "n");  /* t.n = number of elements */
  return 1;  /* return table */
}